

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPrimAttrIdentifier(AsciiParser *this,string *token)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ostream *poVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool local_1041;
  string local_1018 [32];
  string local_ff8;
  allocator local_fd1;
  string local_fd0 [32];
  fmt local_fb0 [32];
  ostringstream local_f90 [8];
  ostringstream ss_e_6;
  string local_e18;
  allocator local_df1;
  string local_df0 [32];
  fmt local_dd0 [32];
  ostringstream local_db0 [8];
  ostringstream ss_e_5;
  allocator local_c31;
  string local_c30;
  allocator local_c09;
  string local_c08;
  undefined1 local_be8 [8];
  string tok;
  ostringstream local_ba8 [8];
  ostringstream ss_e_4;
  string local_a30 [32];
  string local_a10;
  string local_9f0;
  allocator local_9c9;
  string local_9c8 [32];
  string local_9a8;
  ostringstream local_988 [8];
  ostringstream ss_e_3;
  string local_810;
  allocator local_7e9;
  string local_7e8;
  Path local_7c8;
  undefined1 local_6f8 [8];
  string name_err;
  ostringstream local_6b8 [8];
  ostringstream ss_e_2;
  string local_540 [32];
  string local_520;
  ostringstream local_500 [8];
  ostringstream ss_e_1;
  string local_388 [32];
  string local_368;
  ostringstream local_348 [8];
  ostringstream ss_e;
  string local_1d0 [32];
  int local_1b0;
  char local_1a9;
  stringstream local_1a8 [7];
  char c;
  stringstream ss;
  ostream aoStack_198 [376];
  string *local_20;
  string *token_local;
  AsciiParser *this_local;
  
  local_20 = token;
  token_local = (string *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  while (bVar2 = Eof(this), ((bVar2 ^ 0xffU) & 1) != 0) {
    bVar2 = Char1(this,&local_1a9);
    if (!bVar2) {
      this_local._7_1_ = 0;
      local_1b0 = 1;
      goto LAB_0058e72f;
    }
    if (local_1a9 != '_') {
      if (local_1a9 == ':') {
        ::std::__cxx11::stringstream::str();
        lVar4 = ::std::__cxx11::string::size();
        ::std::__cxx11::string::~string(local_1d0);
        if (lVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_348);
          poVar6 = ::std::operator<<((ostream *)local_348,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x600);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)local_348,"PrimAttr name must not starts with `:`");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_368);
          ::std::__cxx11::string::~string((string *)&local_368);
          this_local._7_1_ = 0;
          local_1b0 = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_348);
          goto LAB_0058e72f;
        }
      }
      else if (local_1a9 == '.') {
        ::std::__cxx11::stringstream::str();
        lVar4 = ::std::__cxx11::string::size();
        ::std::__cxx11::string::~string(local_388);
        if (lVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_500);
          poVar6 = ::std::operator<<((ostream *)local_500,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x605);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)local_500,"PrimAttr name must not starts with `.`");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_520);
          ::std::__cxx11::string::~string((string *)&local_520);
          this_local._7_1_ = 0;
          local_1b0 = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_500);
          goto LAB_0058e72f;
        }
      }
      else {
        iVar3 = isalnum((int)local_1a9);
        if (iVar3 == 0) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        ::std::__cxx11::stringstream::str();
        lVar4 = ::std::__cxx11::string::size();
        ::std::__cxx11::string::~string(local_540);
        if ((lVar4 == 0) && (iVar3 = isalpha((int)local_1a9), iVar3 == 0)) {
          ::std::__cxx11::ostringstream::ostringstream(local_6b8);
          poVar6 = ::std::operator<<((ostream *)local_6b8,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x60b);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)local_6b8,
                                     "PrimAttr name must not starts with number.");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&name_err.field_2 + 8));
          ::std::__cxx11::string::~string((string *)(name_err.field_2._M_local_buf + 8));
          this_local._7_1_ = 0;
          local_1b0 = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_6b8);
          goto LAB_0058e72f;
        }
      }
    }
    (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
    ::std::operator<<(aoStack_198,local_1a9);
  }
  ::std::__cxx11::string::string((string *)local_6f8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_7e8,"",&local_7e9);
  ::std::__cxx11::stringstream::str();
  Path::Path(&local_7c8,&local_7e8,&local_810);
  bVar2 = pathutil::ValidatePropPath(&local_7c8,(string *)local_6f8);
  Path::~Path(&local_7c8);
  ::std::__cxx11::string::~string((string *)&local_810);
  ::std::__cxx11::string::~string((string *)&local_7e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_1b0 = 0;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_988);
    poVar6 = ::std::operator<<((ostream *)local_988,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,"[ASCII]");
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x61d);
    ::std::operator<<(poVar6," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_9c8,"Invalid Property name `{}`: {}",&local_9c9);
    ::std::__cxx11::stringstream::str();
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              (&local_9a8,(fmt *)local_9c8,&local_9f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8,in_R8)
    ;
    poVar6 = ::std::operator<<((ostream *)local_988,(string *)&local_9a8);
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::string::~string((string *)&local_9a8);
    ::std::__cxx11::string::~string((string *)&local_9f0);
    ::std::__cxx11::string::~string(local_9c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_a10);
    ::std::__cxx11::string::~string((string *)&local_a10);
    this_local._7_1_ = 0;
    local_1b0 = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_988);
  }
  ::std::__cxx11::string::~string((string *)local_6f8);
  if (local_1b0 != 0) goto LAB_0058e72f;
  ::std::__cxx11::stringstream::str();
  pcVar5 = (char *)::std::__cxx11::string::back();
  cVar1 = *pcVar5;
  ::std::__cxx11::string::~string(local_a30);
  if (cVar1 == '.') {
    ::std::__cxx11::ostringstream::ostringstream(local_ba8);
    poVar6 = ::std::operator<<((ostream *)local_ba8,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x623);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)local_ba8,"PrimAttr name must not ends with `.`\n");
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)((long)&tok.field_2 + 8));
    ::std::__cxx11::string::~string((string *)(tok.field_2._M_local_buf + 8));
    this_local._7_1_ = 0;
    local_1b0 = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_ba8);
    goto LAB_0058e72f;
  }
  ::std::__cxx11::stringstream::str();
  bVar2 = contains((string *)local_be8,'.');
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_c08,".connect",&local_c09);
    bVar2 = endsWith((string *)local_be8,&local_c08);
    local_1041 = true;
    if (!bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_c30,".timeSamples",&local_c31);
      local_1041 = endsWith((string *)local_be8,&local_c30);
      ::std::__cxx11::string::~string((string *)&local_c30);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c31);
    }
    ::std::__cxx11::string::~string((string *)&local_c08);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_c09);
    if (local_1041 == false) {
      ::std::__cxx11::ostringstream::ostringstream(local_db0);
      poVar6 = ::std::operator<<((ostream *)local_db0,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[ASCII]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x630);
      ::std::operator<<(poVar6," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_df0,"Must ends with `.connect` or `.timeSamples` for attrbute name: `{}`",
                 &local_df1);
      fmt::format<std::__cxx11::string>
                (local_dd0,(string *)local_df0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
      poVar6 = ::std::operator<<((ostream *)local_db0,(string *)local_dd0);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::~string((string *)local_dd0);
      ::std::__cxx11::string::~string(local_df0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_df1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_e18);
      ::std::__cxx11::string::~string((string *)&local_e18);
      this_local._7_1_ = 0;
      local_1b0 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_db0);
    }
    else {
      sVar7 = counts((string *)local_be8,'.');
      if (sVar7 < 2) goto LAB_0058e6e6;
      ::std::__cxx11::ostringstream::ostringstream(local_f90);
      poVar6 = ::std::operator<<((ostream *)local_f90,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[ASCII]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadPrimAttrIdentifier");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x638);
      ::std::operator<<(poVar6," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_fd0,"Attribute identifier `{}` containing multiple `.` is not allowed.",
                 &local_fd1);
      fmt::format<std::__cxx11::string>
                (local_fb0,(string *)local_fd0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
      poVar6 = ::std::operator<<((ostream *)local_f90,(string *)local_fb0);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::~string((string *)local_fb0);
      ::std::__cxx11::string::~string(local_fd0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_ff8);
      ::std::__cxx11::string::~string((string *)&local_ff8);
      this_local._7_1_ = 0;
      local_1b0 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_f90);
    }
  }
  else {
LAB_0058e6e6:
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::string::operator=((string *)local_20,local_1018);
    ::std::__cxx11::string::~string(local_1018);
    this_local._7_1_ = 1;
    local_1b0 = 1;
  }
  ::std::__cxx11::string::~string((string *)local_be8);
LAB_0058e72f:
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadPrimAttrIdentifier(std::string *token) {
  // Example:
  // - xformOp:transform
  // - primvars:uvmap1

  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (c == ':') {  // namespace
      // ':' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `:`");
      }
    } else if (c == '.') {  // delimiter for `connect`
      // '.' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `.`");
      }
    } else if (std::isalnum(int(c))) {
      // number must not be allowed for the first char.
      if (ss.str().size() == 0) {
        if (!std::isalpha(int(c))) {
          PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with number.");
        }
      }
    } else {
      _sr->seek_from_current(-1);
      break;
    }

    _curr_cursor.col++;

    ss << c;
  }

  {
    std::string name_err;
    if (!pathutil::ValidatePropPath(Path("", ss.str()), &name_err)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii,
          fmt::format("Invalid Property name `{}`: {}", ss.str(), name_err));
    }
  }

  // '.' must lie in the middle of string literal
  if (ss.str().back() == '.') {
    PUSH_ERROR_AND_RETURN("PrimAttr name must not ends with `.`\n");
    return false;
  }

  std::string tok = ss.str();

  if (contains(tok, '.')) {
    if (endsWith(tok, ".connect") || endsWith(tok, ".timeSamples")) {
      // OK
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Must ends with `.connect` or `.timeSamples` for "
                              "attrbute name: `{}`",
                              tok));
    }

    // Multiple `.` is not allowed(e.g. attr.connect.timeSamples)
    if (counts(tok, '.') > 1) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Attribute identifier `{}` containing multiple "
                              "`.` is not allowed.",
                              tok));
    }
  }

  (*token) = ss.str();
  DCOUT("primAttr identifier = " << (*token));
  return true;
}